

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,longlong value)

{
  iterator pcVar1;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ptrdiff_t _Num;
  ulong __n;
  undefined1 auStack_38 [32];
  
  uVar6 = -value;
  if (0 < value) {
    uVar6 = value;
  }
  lVar3 = 0x3f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar8 = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  __n = (ulong)((uVar8 - (uVar6 < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)
                                         [uVar8])) + 1);
  if (value < 0) {
    pcVar1 = this->out_;
    this->out_ = pcVar1 + 1;
    *pcVar1 = '-';
  }
  puVar4 = auStack_38 + __n;
  uVar7 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar7 / 100;
      *(undefined2 *)(puVar4 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar6 * -100) * 2)
      ;
      puVar4 = puVar4 + -2;
      bVar2 = 9999 < uVar7;
      uVar7 = uVar6;
    } while (bVar2);
  }
  pcVar1 = this->out_;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar3 = -1;
  }
  else {
    puVar4[-1] = internal::basic_data<void>::DIGITS[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[uVar6 * 2 & 0x1fffffffe];
    lVar3 = -2;
  }
  puVar4[lVar3] = bVar5;
  if (__n != 0) {
    memcpy(pcVar1,auStack_38,__n);
  }
  this->out_ = pcVar1 + __n;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }